

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.h
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
rlib::midi::EventExclusive::midiMessage(EventExclusive *this)

{
  iterator __last;
  const_iterator this_00;
  long in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff78;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffff80;
  value_type_conflict *in_stack_ffffffffffffff88;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffffd0;
  const_iterator in_stack_ffffffffffffffd8;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1d70b5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (in_RDI,in_stack_ffffffffffffff88);
  __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                     (in_stack_ffffffffffffff78);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            (in_stack_ffffffffffffff80,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_ffffffffffffff78);
  this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RSI + 8);
  this_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      (in_stack_ffffffffffffff78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_ffffffffffffff78);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00._M_current,
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__last._M_current);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (this_01,(value_type_conflict *)in_stack_ffffffffffffff78);
  return in_RDI;
}

Assistant:

virtual std::vector<uint8_t> midiMessage() const {
			std::vector<uint8_t> v;
			v.push_back(statusByte);
			v.insert(v.end(), data.begin(), data.end());
			v.push_back(static_cast<unsigned char>(0xf7));			// 終了コード
			return v;
		}